

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

int WOPN_LoadInstFromMem(OPNIFile *file,void *mem,size_t length)

{
  int iVar1;
  uint8_t *puStack_38;
  uint16_t ins_size;
  uint8_t *cursor;
  ulong uStack_28;
  uint16_t version;
  size_t length_local;
  void *mem_local;
  OPNIFile *file_local;
  
  cursor._6_2_ = 0;
  if (mem == (void *)0x0) {
    file_local._4_4_ = 6;
  }
  else if (length < 0xb) {
    file_local._4_4_ = 2;
  }
  else {
    iVar1 = memcmp(mem,opni_magic1,0xb);
    if (iVar1 == 0) {
      cursor._6_2_ = 1;
    }
    else {
      iVar1 = memcmp(mem,opni_magic2,0xb);
      if (iVar1 != 0) {
        return 1;
      }
    }
    puStack_38 = (uint8_t *)((long)mem + 0xb);
    uStack_28 = length - 0xb;
    if (cursor._6_2_ == 0) {
      if (uStack_28 < 2) {
        return 2;
      }
      cursor._6_2_ = toUint16LE(puStack_38);
      if (2 < cursor._6_2_) {
        return 4;
      }
      puStack_38 = (uint8_t *)((long)mem + 0xd);
      uStack_28 = length - 0xd;
    }
    file->version = cursor._6_2_;
    if (uStack_28 == 0) {
      file_local._4_4_ = 2;
    }
    else {
      file->is_drum = *puStack_38;
      if (uStack_28 - 1 < 0x41) {
        file_local._4_4_ = 2;
      }
      else {
        WOPN_parseInstrument(&file->inst,puStack_38 + 1,cursor._6_2_,'\0');
        file_local._4_4_ = 0;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int WOPN_LoadInstFromMem(OPNIFile *file, void *mem, size_t length)
{
    uint16_t version = 0;
    uint8_t *cursor = (uint8_t *)mem;
    uint16_t ins_size;

    if(!cursor)
        return WOPN_ERR_NULL_POINTER;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    {/* Magic number */
        if(length < 11)
            return WOPN_ERR_UNEXPECTED_ENDING;
        if(memcmp(cursor, opni_magic1, 11) == 0)
            version = 1;
        else if(memcmp(cursor, opni_magic2, 11) != 0)
            return WOPN_ERR_BAD_MAGIC;
        GO_FORWARD(11);
    }

    if (version == 0) {/* Version code */
        if(length < 2)
            return WOPN_ERR_UNEXPECTED_ENDING;
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
            return WOPN_ERR_NEWER_VERSION;
        GO_FORWARD(2);
    }

    file->version = version;

    {/* is drum flag */
        if(length < 1)
            return WOPN_ERR_UNEXPECTED_ENDING;
        file->is_drum = *cursor;
        GO_FORWARD(1);
    }

    if(version > 1)
        /* Skip sounding delays are not part of single-instrument file
         * two sizes of uint16_t will be subtracted */
        ins_size = WOPN_INST_SIZE_V2 - (sizeof(uint16_t) * 2);
    else
        ins_size = WOPN_INST_SIZE_V1;

    if(length < ins_size)
        return WOPN_ERR_UNEXPECTED_ENDING;

    WOPN_parseInstrument(&file->inst, cursor, version, 0);
    GO_FORWARD(ins_size);

    return WOPN_ERR_OK;
#undef GO_FORWARD
}